

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<cs_impl::any,cs_impl::any>::
     construct<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>,std::piecewise_construct_t_const&,std::tuple<cs_impl::any&&>,std::tuple<cs_impl::any&&>>
               (allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *alloc,slot_type *slot,
               piecewise_construct_t *args,tuple<cs_impl::any_&&> *args_1,
               tuple<cs_impl::any_&&> *args_2)

{
  piecewise_construct_t *in_RCX;
  pair<cs_impl::any,_cs_impl::any> *in_RDX;
  allocator<std::pair<const_cs_impl::any,_cs_impl::any>_> *in_RSI;
  tuple<cs_impl::any_&&> *in_R8;
  
  map_slot_policy<cs_impl::any,_cs_impl::any>::emplace((slot_type *)0x2acda6);
  allocator_traits<std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>::
  construct<std::pair<cs_impl::any,cs_impl::any>,std::piecewise_construct_t_const&,std::tuple<cs_impl::any&&>,std::tuple<cs_impl::any&&>>
            (in_RSI,in_RDX,in_RCX,in_R8,(tuple<cs_impl::any_&&> *)0x2acdc3);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args)
			{
				emplace(slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
					        std::forward<Args>(args)...);
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
					        std::forward<Args>(args)...);
				}
			}